

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ReporterSpec::ReporterSpec
          (ReporterSpec *this,string *name,
          Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *outputFileName,Optional<Catch::ColourMode> *colourMode,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *customOptions)

{
  char *pcVar1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Optional(&this->m_outputFileName,outputFileName);
  if (colourMode->nullableValue == (ColourMode *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (this->m_colourMode).storage;
    (this->m_colourMode).storage[0] = *colourMode->nullableValue;
  }
  (this->m_colourMode).nullableValue = (ColourMode *)pcVar1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_customOptions)._M_t._M_impl.super__Rb_tree_header,
             &(customOptions->_M_t)._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

ReporterSpec::ReporterSpec(
        std::string name,
        Optional<std::string> outputFileName,
        Optional<ColourMode> colourMode,
        std::map<std::string, std::string> customOptions ):
        m_name( CATCH_MOVE( name ) ),
        m_outputFileName( CATCH_MOVE( outputFileName ) ),
        m_colourMode( CATCH_MOVE( colourMode ) ),
        m_customOptions( CATCH_MOVE( customOptions ) ) {}